

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

int cmime_message_append_part(CMimeMessage_T *message,CMimePart_T *part)

{
  void *pvVar1;
  char *pcVar2;
  CMimePart_T *prev;
  CMimeListElem_T *elem;
  CMimePart_T *part_local;
  CMimeMessage_T *message_local;
  
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x47c,"int cmime_message_append_part(CMimeMessage_T *, CMimePart_T *)");
  }
  if (part == (CMimePart_T *)0x0) {
    __assert_fail("part",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x47d,"int cmime_message_append_part(CMimeMessage_T *, CMimePart_T *)");
  }
  if (message->parts->size == 1) {
    _rebuild_first_part(message);
  }
  if (0 < message->parts->size) {
    pvVar1 = message->parts->tail->data;
    *(undefined2 *)((long)pvVar1 + 0x28) = 0;
    part->last = 1;
    pcVar2 = strdup(*(char **)((long)pvVar1 + 0x18));
    part->parent_boundary = pcVar2;
    cmime_list_append(message->parts,part);
  }
  return 0;
}

Assistant:

int cmime_message_append_part(CMimeMessage_T *message, CMimePart_T *part) {
    CMimeListElem_T *elem = NULL;
    CMimePart_T *prev = NULL;
    assert(message);
    assert(part);
    
    if (message->parts->size == 1) {
        _rebuild_first_part(message); 
    }

    if (message->parts->size >= 1) {
        elem = cmime_list_tail(message->parts);
        prev = cmime_list_data(elem);
        prev->last = 0;
        part->last = 1;
        part->parent_boundary = strdup(prev->parent_boundary);
        cmime_list_append(message->parts,part);
        return(0);
    }  
    return(0);
}